

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int balance(BtCursor *pCur)

{
  u8 *puVar1;
  byte bVar2;
  u8 uVar3;
  ushort uVar4;
  u32 uVar5;
  u8 *puVar6;
  uint *puVar7;
  PgHdr *pPVar8;
  u8 uVar9;
  u8 uVar10;
  void *pvVar11;
  u8 **ppuVar12;
  u16 uVar13;
  ushort uVar14;
  ushort uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  undefined1 *puVar19;
  ulong uVar20;
  ulong extraout_RAX;
  Pgno PVar21;
  int nNew;
  long lVar22;
  MemPage **ppMVar23;
  int iNew;
  ulong uVar24;
  ulong uVar25;
  MemPage **ppMVar26;
  char cVar27;
  ulong uVar28;
  BtShared *pBVar29;
  MemPage *pMVar30;
  uint uVar31;
  u8 *puVar32;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  MemPage **ppMVar36;
  MemPage *pMVar37;
  MemPage **ppMVar38;
  size_t __n;
  MemPage *pMVar39;
  void *pvVar40;
  uint uVar41;
  long lVar42;
  MemPage **ppMVar43;
  MemPage *pMVar44;
  uint uVar45;
  bool bVar46;
  MemPage *apOld [3];
  MemPage *pNew;
  Pgno pgnoNew;
  int szNew [5];
  u8 abDone [5];
  u16 szCell;
  MemPage *pChild;
  Pgno aPgOrder [5];
  u8 *apDiv [2];
  u16 aPgFlags [5];
  u8 aBalanceQuickSpace [13];
  Pgno aPgno [5];
  int local_2ac;
  MemPage *local_2a8;
  BtCursor *local_2a0;
  MemPage **local_298;
  MemPage **local_290;
  MemPage **local_288;
  ulong local_280;
  char local_271;
  BtShared *local_270;
  ulong local_268;
  MemPage **local_260;
  ulong local_258;
  MemPage *local_250;
  ulong local_248;
  undefined8 uStack_240;
  MemPage *local_238 [4];
  ulong local_218;
  ulong local_210;
  undefined8 local_208;
  MemPage *local_200 [4];
  uint uStack_1dc;
  Pgno local_1d8;
  uint local_1d4 [5];
  undefined8 local_1c0;
  uint auStack_1b8 [7];
  undefined4 local_19c;
  undefined1 local_198;
  uint local_194;
  uint *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  ulong local_170;
  void *local_168;
  ulong local_160;
  MemPage *local_158 [4];
  CellInfo local_138;
  MemPage *local_120;
  MemPage *local_118;
  CellArray local_110;
  uint auStack_a8 [8];
  long alStack_88 [4];
  ulong local_68;
  u16 auStack_60 [5];
  u8 local_55 [4];
  u8 auStack_51 [9];
  Pgno aPStack_48 [6];
  
  local_68 = (ulong)(pCur->pBt->usableSize * 2) / 3;
  cVar27 = pCur->iPage;
  local_188 = (void *)0x0;
  pMVar39 = pCur->pPage;
  local_2a0 = pCur;
LAB_001785fb:
  if ((pMVar39->nFree < 0) && (iVar16 = btreeComputeFreeSpace(pMVar39), iVar16 != 0)) {
LAB_0017a028:
    iVar16 = 0;
  }
  else {
    if (cVar27 != '\0') {
      if ((pMVar39->nOverflow == '\0') && (pMVar39->nFree <= (int)local_68)) goto LAB_0017a028;
      pMVar30 = pCur->apPage[(long)cVar27 + -1];
      uVar14 = pCur->aiIdx[(long)cVar27 + -1];
      iVar16 = sqlite3PagerWrite(pMVar30->pDbPage);
      if ((iVar16 == 0) &&
         ((local_271 = cVar27, -1 < pMVar30->nFree ||
          (iVar16 = btreeComputeFreeSpace(pMVar30), iVar16 == 0)))) {
        local_2a8 = pMVar30;
        if (((pMVar39->intKeyLeaf != '\0') &&
            (((pMVar39->nOverflow == '\x01' && (pMVar39->aiOvfl[0] == pMVar39->nCell)) &&
             (pMVar30->pgno != 1)))) && (pMVar30->nCell == uVar14)) {
          if (pMVar39->aiOvfl[0] == 0) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            iVar16 = 0xb;
          }
          else {
            pBVar29 = pMVar39->pBt;
            iVar16 = allocateBtreePage(pBVar29,(MemPage **)&local_208,&local_1d8,0,'\0');
            if (iVar16 == 0) {
              local_238[0] = (MemPage *)pMVar39->apOvfl[0];
              local_158[0]._0_2_ = (*pMVar39->xCellSize)(pMVar39,(u8 *)local_238[0]);
              pMVar30 = (MemPage *)CONCAT44(local_208._4_4_,(int)local_208);
              zeroPage(pMVar30,0xd);
              local_110.nCell = 1;
              local_110.apCell = (u8 **)local_238;
              local_110.szCell = (u16 *)local_158;
              local_110.apEnd[0] = pMVar39->aDataEnd;
              local_110.ixNx[0] = 2;
              local_110.pRef = pMVar39;
              iVar16 = rebuildPage(&local_110,0,1,pMVar30);
              local_138.nKey._0_4_ = iVar16;
              if (iVar16 == 0) {
                pMVar30->nFree =
                     (pBVar29->usableSize - ((uint)(ushort)local_158[0] + (uint)pMVar30->cellOffset)
                     ) + -2;
                if ((pBVar29->autoVacuum != '\0') &&
                   (ptrmapPut(pBVar29,local_1d8,'\x05',local_2a8->pgno,(int *)&local_138),
                   pMVar30->minLocal < (ushort)local_158[0])) {
                  ptrmapPutOvflPtr(pMVar30,pMVar30,&local_238[0]->isInit,(int *)&local_138);
                }
                uVar28 = (ulong)(CONCAT11(pMVar39->aCellIdx[(ulong)pMVar39->nCell * 2 + -2],
                                          pMVar39->aCellIdx[(ulong)pMVar39->nCell * 2 + -1]) &
                                pMVar39->maskPage);
                uVar35 = 0;
                puVar6 = pMVar39->aData + uVar28;
                pMVar44 = (MemPage *)(pMVar39->aData + uVar28 + 2);
                do {
                  pMVar37 = pMVar44;
                  puVar32 = puVar6;
                  if (7 < uVar35) break;
                  uVar35 = uVar35 + 1;
                  puVar6 = puVar32 + 1;
                  pMVar44 = (MemPage *)&pMVar37->bBusy;
                } while ((char)*puVar32 < '\0');
                lVar22 = 4;
                do {
                  local_238[0] = pMVar37;
                  uVar3 = *(u8 *)((long)&local_238[0][-1].xParseCell + 7);
                  local_55[lVar22] = uVar3;
                  lVar22 = lVar22 + 1;
                  if (-1 < (char)uVar3) break;
                  pMVar37 = (MemPage *)&local_238[0]->bBusy;
                } while (local_238[0] < (MemPage *)(puVar32 + 10));
                if ((int)local_138.nKey == 0) {
                  insertCell(local_2a8,(uint)local_2a8->nCell,local_55,(int)lVar22,(u8 *)0x0,
                             pMVar39->pgno,(int *)&local_138);
                }
                *(Pgno *)(local_2a8->aData + (ulong)local_2a8->hdrOffset + 8) =
                     local_1d8 >> 0x18 | (local_1d8 & 0xff0000) >> 8 | (local_1d8 & 0xff00) << 8 |
                     local_1d8 << 0x18;
                iVar16 = (int)local_138.nKey;
                if (pMVar30 != (MemPage *)0x0) {
                  sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
                  iVar16 = (int)local_138.nKey;
                }
              }
              else if (pMVar30 != (MemPage *)0x0) {
                sqlite3PagerUnrefNotNull(pMVar30->pDbPage);
              }
            }
          }
          goto LAB_00178ae2;
        }
        local_180 = pcache1Alloc(pCur->pBt->pageSize);
        local_19c = 0;
        local_198 = 0;
        local_110._0_8_ = local_110._0_8_ & 0xffffffff00000000;
        local_110.apCell = (u8 **)0x0;
        if (local_180 != (void *)0x0) {
          uVar33 = pCur->hints & 1;
          local_268 = (ulong)uVar33;
          uVar31 = (uint)local_2a8->nCell + (uint)local_2a8->nOverflow;
          local_248 = 0;
          if (1 < uVar31) {
            uVar45 = (uint)uVar14;
            if (uVar45 == 0) {
              local_248 = 0;
            }
            else if (uVar31 == uVar45) {
              local_248 = (ulong)((uVar14 + uVar33) - 2);
            }
            else {
              local_248 = (ulong)(uVar45 - 1);
            }
            uVar31 = 2 - uVar33;
          }
          uVar28 = (ulong)uVar31;
          uVar33 = ((int)local_248 - (uint)local_2a8->nOverflow) + uVar31;
          puVar6 = local_2a8->aData;
          if (uVar33 == local_2a8->nCell) {
            uVar35 = (ulong)local_2a8->hdrOffset + 8;
          }
          else {
            uVar35 = (ulong)(CONCAT11(local_2a8->aCellIdx[(long)(int)uVar33 * 2],
                                      local_2a8->aCellIdx[(long)(int)uVar33 * 2 + 1]) &
                            local_2a8->maskPage);
          }
          local_270 = local_2a8->pBt;
          uVar45 = uVar31 + 1;
          uVar33 = *(uint *)(puVar6 + uVar35);
          uVar33 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 |
                   uVar33 << 0x18;
          local_118 = pMVar39;
          iVar16 = getAndInitPage(local_270,uVar33,local_238 + uVar28,(BtCursor *)0x0,0);
          local_250 = (MemPage *)CONCAT44(local_250._4_4_,uVar45);
          local_160 = (ulong)uVar45;
          if (iVar16 == 0) {
            local_290 = (MemPage **)CONCAT44(local_290._4_4_,uVar33);
            local_190 = (uint *)(puVar6 + uVar35);
            local_170 = uVar28;
            __n = (size_t)(uVar31 * 8);
            local_280 = (long)(int)local_248 - 1;
            local_1c0 = uVar28;
            pBVar29 = local_270;
            pMVar39 = local_2a8;
            local_2ac = iVar16;
            do {
              if ((local_238[uVar28]->nFree < 0) &&
                 (iVar16 = btreeComputeFreeSpace(local_238[uVar28]), local_2ac = iVar16, iVar16 != 0
                 )) {
LAB_0017952b:
                uVar31 = 0;
                memset(local_238,0,__n);
                pCur = local_2a0;
                goto LAB_00178a58;
              }
              uVar35 = uVar28 - 1;
              if (uVar28 == 0) {
                uStack_240._4_4_ = (uint)local_290;
                uVar31 = ((pBVar29->pageSize - 8) / 6 + 4) * (uint)local_250 + 3 & 0xfffffffc;
                local_110.apCell =
                     (u8 **)sqlite3Malloc((long)(int)(pBVar29->pageSize + uVar31 * 10));
                if ((MemPage **)local_110.apCell != (MemPage **)0x0) {
                  lVar22 = (long)(int)uVar31;
                  local_288 = (MemPage **)local_110.apCell + lVar22;
                  local_110.szCell = (u16 *)local_288;
                  local_168 = (void *)((long)local_288 + lVar22 * 2);
                  local_110.pRef = local_238[0];
                  local_194 = (uint)local_238[0]->leaf;
                  local_218 = (ulong)local_238[0]->leaf << 2;
                  local_120 = local_238[0];
                  local_280 = (ulong)local_238[0]->intKeyLeaf;
                  local_178 = (void *)((long)local_110.apCell + lVar22 * 10);
                  uVar28 = 0;
                  ppMVar43 = (MemPage **)0x0;
                  iVar16 = 0;
                  local_260 = (MemPage **)local_110.apCell;
                  goto LAB_00178db9;
                }
                uVar31 = 0;
                iVar16 = 7;
                pCur = local_2a0;
                goto LAB_00178a6a;
              }
              if (pMVar39->nOverflow == 0) {
                iVar16 = (int)uVar28 + (int)local_280;
LAB_00178bdb:
                puVar32 = pMVar39->aData;
                lVar22 = (long)(int)(iVar16 - (uint)pMVar39->nOverflow);
                uVar14 = CONCAT11(pMVar39->aCellIdx[lVar22 * 2],pMVar39->aCellIdx[lVar22 * 2 + 1]) &
                         pMVar39->maskPage;
                puVar6 = puVar32 + uVar14;
                alStack_88[uVar35] = (long)puVar6;
                local_290 = (MemPage **)CONCAT44(local_290._4_4_,*(undefined4 *)(puVar32 + uVar14));
                uVar13 = (*pMVar39->xCellSize)(pMVar39,puVar6);
                auStack_1b8[uVar28 - 1] = (uint)uVar13;
                pvVar40 = local_180;
                if ((local_270->btsFlags & 0xc) != 0) {
                  iVar17 = (int)puVar6 - *(int *)&pMVar39->aData;
                  if ((int)local_270->usableSize < (int)(iVar17 + (uint)uVar13)) {
                    iVar16 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
                    goto LAB_0017952b;
                  }
                  memcpy((void *)((long)iVar17 + (long)local_180),puVar6,(ulong)(uint)uVar13);
                  alStack_88[uVar35] = ((long)puVar6 - (long)local_2a8->aData) + (long)pvVar40;
                  pMVar39 = local_2a8;
                }
                uVar31 = (uint)local_290 >> 0x18 | ((uint)local_290 & 0xff0000) >> 8 |
                         ((uint)local_290 & 0xff00) << 8 | (uint)local_290 << 0x18;
                dropCell(pMVar39,iVar16 - (uint)pMVar39->nOverflow,(uint)uVar13,&local_2ac);
                pBVar29 = local_270;
              }
              else {
                if ((int)uVar28 + (int)local_280 != (uint)pMVar39->aiOvfl[0]) {
                  iVar16 = (int)local_248 + (int)uVar35;
                  goto LAB_00178bdb;
                }
                puVar7 = (uint *)pMVar39->apOvfl[0];
                alStack_88[uVar35] = (long)puVar7;
                uVar31 = *puVar7;
                uVar31 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 | (uVar31 & 0xff00) << 8 |
                         uVar31 << 0x18;
                uVar13 = (*pMVar39->xCellSize)(pMVar39,(u8 *)puVar7);
                auStack_1b8[uVar28 - 1] = (uint)uVar13;
                pMVar39->nOverflow = '\0';
              }
              local_290 = (MemPage **)CONCAT44(local_290._4_4_,uVar31);
              iVar16 = getAndInitPage(pBVar29,uVar31,(MemPage **)((long)&uStack_240 + __n),
                                      (BtCursor *)0x0,0);
              __n = __n - 8;
              uVar28 = uVar35;
              local_2ac = iVar16;
            } while (iVar16 == 0);
            uVar45 = (int)uVar35 + 1;
          }
          pCur = local_2a0;
          local_2ac = iVar16;
          memset(local_238,0,(long)(int)uVar45 << 3);
          uVar31 = 0;
          goto LAB_00178a58;
        }
        iVar16 = 7;
        goto LAB_00178ac0;
      }
      goto LAB_00178ae2;
    }
    if (pMVar39->nOverflow == '\0') goto LAB_0017a028;
    local_110._0_8_ = (MemPage *)0x0;
    local_238[0] = (MemPage *)((ulong)local_238[0] & 0xffffffff00000000);
    pBVar29 = pMVar39->pBt;
    iVar16 = sqlite3PagerWrite(pMVar39->pDbPage);
    if (iVar16 == 0) {
      local_208._0_4_ =
           allocateBtreePage(pBVar29,(MemPage **)&local_110,(Pgno *)local_238,pMVar39->pgno,'\0');
      pMVar30 = (MemPage *)local_110._0_8_;
      copyNodeContent(pMVar39,(MemPage *)local_110._0_8_,(int *)&local_208);
      if (pBVar29->autoVacuum != '\0') {
        ptrmapPut(pBVar29,(Pgno)local_238[0],'\x05',pMVar39->pgno,(int *)&local_208);
      }
      iVar16 = (int)local_208;
      if ((int)local_208 == 0) {
        memcpy((u16 *)((long)pMVar30 + 0x1c),pMVar39->aiOvfl,(ulong)((uint)pMVar39->nOverflow * 2));
        memcpy((u8 **)((long)pMVar30 + 0x28),pMVar39->apOvfl,(ulong)pMVar39->nOverflow << 3);
        *(u8 *)((long)pMVar30 + 0xc) = pMVar39->nOverflow;
        zeroPage(pMVar39,**(u8 **)((long)pMVar30 + 0x50) & 0xfffffff7);
        *(Pgno *)(pMVar39->aData + (ulong)pMVar39->hdrOffset + 8) =
             (Pgno)local_238[0] >> 0x18 | ((Pgno)local_238[0] & 0xff0000) >> 8 |
             ((Pgno)local_238[0] & 0xff00) << 8 | (Pgno)local_238[0] << 0x18;
        pCur->apPage[1] = pMVar30;
        pCur->iPage = '\x01';
        pCur->ix = 0;
        pCur->aiIdx[0] = 0;
        pCur->apPage[0] = pMVar39;
        iVar16 = 0;
        cVar27 = '\x01';
        goto LAB_00178b06;
      }
      pCur->apPage[1] = (MemPage *)0x0;
      if (pMVar30 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(*(DbPage **)((long)pMVar30 + 0x70));
      }
    }
    else {
      pCur->apPage[1] = (MemPage *)0x0;
    }
  }
  goto LAB_0017a056;
  while( true ) {
    local_258 = (ulong)pMVar39->nCell;
    uVar14 = pMVar39->maskPage;
    puVar32 = puVar6 + pMVar39->cellOffset;
    lVar22 = (long)iVar16;
    local_298 = ppMVar43;
    local_210 = uVar28;
    memset((void *)((long)local_288 + lVar22 * 2),0,
           (ulong)(((uint)pMVar39->nCell + (uint)pMVar39->nOverflow) * 2));
    uVar28 = local_210;
    bVar2 = pMVar39->nOverflow;
    if ((ulong)bVar2 != 0) {
      uVar15 = pMVar39->aiOvfl[0];
      if ((ushort)local_258 < uVar15) goto LAB_00179616;
      if (uVar15 != 0) {
        lVar42 = lVar22 << 0x20;
        lVar34 = 0;
        do {
          *(u8 **)((long)local_260 + lVar34 * 4 + lVar22 * 8) =
               puVar6 + (uVar14 & CONCAT11(puVar32[lVar34],puVar32[lVar34 + 1]));
          lVar42 = lVar42 + 0x100000000;
          lVar34 = lVar34 + 2;
        } while ((uint)uVar15 * 2 != (int)lVar34);
        lVar22 = lVar42 >> 0x20;
        puVar32 = puVar32 + lVar34;
      }
      uVar35 = 0;
      do {
        local_260[lVar22 + uVar35] = (MemPage *)pMVar39->apOvfl[uVar35];
        uVar35 = uVar35 + 1;
      } while (bVar2 != uVar35);
      iVar16 = (int)lVar22 + (int)uVar35;
      local_110.nCell = iVar16;
    }
    uVar15 = pMVar39->cellOffset;
    uVar4 = pMVar39->nCell;
    if (puVar32 < puVar6 + (ulong)uVar4 * 2 + (ulong)uVar15) {
      lVar22 = (long)iVar16;
      lVar34 = 0;
      do {
        puVar1 = puVar32 + lVar34;
        *(u8 **)((long)local_260 + lVar34 * 4 + lVar22 * 8) =
             puVar6 + (CONCAT11(*puVar1,puVar1[1]) & uVar14);
        iVar16 = iVar16 + 1;
        local_110.nCell = iVar16;
        lVar34 = lVar34 + 2;
      } while (puVar1 + 2 < puVar6 + (ulong)uVar4 * 2 + (ulong)uVar15);
    }
    *(int *)((long)local_158 + local_210 * 4) = iVar16;
    ppMVar43 = local_298;
    if ((local_210 < local_1c0) && ((char)local_280 == '\0')) {
      uVar31 = auStack_1b8[local_210] & 0xffff;
      lVar22 = (long)iVar16;
      *(short *)((long)local_288 + lVar22 * 2) = (short)auStack_1b8[local_210];
      pvVar40 = (void *)((long)local_168 + (long)(int)local_298);
      uVar33 = (int)local_298 + uVar31;
      ppMVar43 = (MemPage **)(ulong)uVar33;
      memcpy(pvVar40,(void *)alStack_88[local_210],(ulong)uVar31);
      pMVar30 = (MemPage *)((long)pvVar40 + local_218);
      local_260[lVar22] = pMVar30;
      uVar14 = *(short *)((long)local_288 + lVar22 * 2) - (short)local_218;
      *(ushort *)((long)local_288 + lVar22 * 2) = uVar14;
      if (pMVar39->leaf == '\0') {
        puVar6 = pMVar39->aData;
        uVar3 = puVar6[9];
        uVar9 = puVar6[10];
        uVar10 = puVar6[0xb];
        pMVar30->isInit = puVar6[8];
        pMVar30->bBusy = uVar3;
        pMVar30->intKey = uVar9;
        pMVar30->intKeyLeaf = uVar10;
      }
      else if (uVar14 < 4) {
        puVar19 = (undefined1 *)((long)(int)uVar33 + (long)local_178);
        do {
          *puVar19 = 0;
          uVar14 = *(short *)((long)local_288 + lVar22 * 2) + 1;
          *(ushort *)((long)local_288 + lVar22 * 2) = uVar14;
          puVar19 = puVar19 + 1;
          ppMVar43 = (MemPage **)(ulong)((int)ppMVar43 + 1);
        } while (uVar14 < 4);
      }
      iVar16 = iVar16 + 1;
      local_110.nCell = iVar16;
    }
    uVar28 = uVar28 + 1;
    if (uVar28 == local_160) break;
LAB_00178db9:
    pMVar39 = local_238[uVar28];
    puVar6 = pMVar39->aData;
    if (*puVar6 != *local_120->aData) goto LAB_00179616;
  }
  alStack_88[3] = local_218 & 0xffff;
  local_210 = CONCAT44(local_210._4_4_,local_270->usableSize + (uint)(ushort)local_218 + -0xc);
  uVar28 = 0;
  iVar16 = 0;
  do {
    pMVar39 = local_238[uVar28];
    local_110.apEnd[iVar16] = pMVar39->aDataEnd;
    uVar31 = *(uint *)((long)local_158 + uVar28 * 4);
    local_110.ixNx[iVar16] = uVar31;
    iVar17 = 0;
    if ((iVar16 != 0) &&
       (iVar17 = iVar16 + -1, uVar31 != local_110.ixNx[(long)iVar16 + 0xffffffffffffffff])) {
      iVar17 = iVar16;
    }
    iVar16 = iVar17;
    if ((int)local_280 == 0) {
      iVar16 = iVar17 + 1;
      local_110.apEnd[(long)iVar17 + 1] = local_2a8->aDataEnd;
      auStack_a8[(long)iVar17 + -5] = uVar31 + 1;
    }
    uVar33 = (int)local_210 - pMVar39->nFree;
    auStack_1b8[uVar28] = uVar33;
    if (pMVar39->nOverflow != '\0') {
      uVar35 = 0;
      do {
        uVar13 = (*pMVar39->xCellSize)(pMVar39,pMVar39->apOvfl[uVar35]);
        uVar33 = uVar33 + uVar13 + 2;
        auStack_1b8[uVar28] = uVar33;
        uVar35 = uVar35 + 1;
      } while (uVar35 < pMVar39->nOverflow);
    }
    (&uStack_1dc)[uVar28 + 1] = uVar31;
    uVar28 = uVar28 + 1;
    iVar16 = iVar16 + 1;
  } while (uVar28 != local_160);
  local_218 = (long)local_110.nCell;
  local_260 = (MemPage **)-(long)local_110.nCell;
  ppMVar43 = (MemPage **)((ulong)local_250 & 0xffffffff);
  local_258 = CONCAT44(local_258._4_4_,local_110.nCell);
  local_298 = (MemPage **)local_110.szCell;
  uVar28 = 0;
  ppMVar38 = (MemPage **)local_110.szCell;
  uVar31 = local_110.nCell;
  do {
    uVar33 = auStack_1b8[uVar28];
    if ((int)local_210 < (int)uVar33) {
      local_288 = (MemPage **)CONCAT44(local_288._4_4_,(int)uVar28 + 2);
      do {
        if ((long)(int)ppMVar43 <= (long)(uVar28 + 1)) {
          if (3 < uVar28) {
            auStack_1b8[uVar28] = uVar33;
            goto LAB_001795ac;
          }
          auStack_1b8[uVar28 + 1] = 0;
          (&uStack_1dc)[uVar28 + 2] = uVar31;
          ppMVar43 = (MemPage **)((ulong)local_288 & 0xffffffff);
        }
        uVar45 = (&uStack_1dc)[uVar28 + 1];
        lVar22 = (long)(int)uVar45;
        uVar35 = lVar22 - 1;
        uVar14 = *(ushort *)((long)ppMVar38 + lVar22 * 2 + -2);
        if (uVar14 == 0) {
          uVar14 = computeCellSize(&local_110,(uint)uVar35);
          ppMVar38 = local_298;
          uVar31 = (uint)local_258;
        }
        iVar16 = uVar14 + 2;
        if (((int)local_280 == 0) && (iVar16 = 0, (int)uVar45 < (int)uVar31)) {
          uVar15 = *(ushort *)((long)ppMVar38 + lVar22 * 2);
          if (uVar15 == 0) {
            uVar15 = computeCellSize(&local_110,uVar45);
            ppMVar38 = local_298;
            uVar31 = (uint)local_258;
          }
          iVar16 = uVar15 + 2;
        }
        auStack_1b8[uVar28 + 1] = auStack_1b8[uVar28 + 1] + iVar16;
        uVar33 = uVar33 - (uVar14 + 2);
        (&uStack_1dc)[uVar28 + 1] = (uint)uVar35;
      } while ((int)local_210 < (int)uVar33);
    }
    else {
      uVar35 = (ulong)(&uStack_1dc)[uVar28 + 1];
    }
    uVar24 = uVar28 + 1;
    auStack_1b8[uVar28] = uVar33;
    if ((int)uVar35 < (int)uVar31) {
      lVar22 = (long)(int)uVar35;
      local_288 = ppMVar43;
      do {
        lVar22 = lVar22 + 1;
        uVar14 = *(ushort *)((long)ppMVar38 + lVar22 * 2 + -2);
        iVar16 = (int)uVar35;
        if (uVar14 == 0) {
          uVar14 = computeCellSize(&local_110,iVar16);
          ppMVar43 = local_288;
          ppMVar38 = local_298;
          uVar31 = (uint)local_258;
        }
        uVar33 = uVar33 + uVar14 + 2;
        if ((int)local_210 < (int)uVar33) {
          if (uVar28 == 0) {
            uVar33 = 0;
          }
          else {
            uVar33 = (&uStack_1dc)[uVar28];
          }
          if (iVar16 <= (int)uVar33) goto LAB_001795ac;
          goto LAB_00179328;
        }
        uVar45 = iVar16 + 1;
        uVar35 = (ulong)uVar45;
        auStack_1b8[uVar28] = uVar33;
        (&uStack_1dc)[uVar28 + 1] = uVar45;
        if ((int)local_280 == 0) {
          iVar16 = 0;
          if (lVar22 < (long)local_218) {
            uVar14 = *(ushort *)((long)ppMVar38 + lVar22 * 2);
            if (uVar14 == 0) {
              uVar14 = computeCellSize(&local_110,uVar45);
              ppMVar43 = local_288;
              ppMVar38 = local_298;
              uVar31 = (uint)local_258;
            }
            goto LAB_001792e7;
          }
        }
        else {
LAB_001792e7:
          iVar16 = uVar14 + 2;
        }
        auStack_1b8[uVar28 + 1] = auStack_1b8[uVar28 + 1] - iVar16;
      } while ((long)local_260 + lVar22 != 0);
    }
    ppMVar43 = (MemPage **)(uVar24 & 0xffffffff);
LAB_00179328:
    uVar28 = uVar24;
  } while ((long)uVar24 < (long)(int)ppMVar43);
  local_178 = (void *)(ulong)((int)ppMVar43 - 1);
  uVar28 = (long)ppMVar38 - (ulong)(uint)((int)local_280 * 2);
  local_218 = uVar28;
  pvVar40 = local_178;
  local_288 = ppMVar43;
  do {
    if ((int)pvVar40 < 1) {
      local_298 = (MemPage **)CONCAT44(local_298._4_4_,(uint)*local_120->aData);
      if (0 < (int)local_288) {
        uVar28 = (ulong)local_288 & 0xffffffff;
        uVar35 = 0;
        uVar33 = 0;
        goto LAB_001797cf;
      }
      local_268 = local_268 & 0xffffffff00000000;
      uVar31 = 0;
      goto LAB_00179a9a;
    }
    uVar31 = *(uint *)((long)&local_1c0 + (long)pvVar40 * 4 + 4);
    uVar33 = auStack_1b8[(long)pvVar40];
    uVar45 = (&uStack_1dc)[(long)pvVar40];
    lVar22 = (long)(int)uVar45 - local_280;
    if (*(short *)((long)ppMVar38 + lVar22 * 2) == 0) {
      computeCellSize(&local_110,(int)lVar22);
      ppMVar38 = local_298;
      uVar28 = local_218;
    }
    local_168 = pvVar40;
    local_260 = (MemPage **)(ulong)((uint)(pvVar40 == local_178) * 2 - 2);
    lVar22 = (long)(int)uVar45 + 1;
    uVar35 = local_268;
    do {
      uVar41 = uVar45 - 1;
      if (*(short *)((long)ppMVar38 + lVar22 * 2 + -4) == 0) {
        computeCellSize(&local_110,uVar41);
        uVar35 = local_268;
        ppMVar38 = local_298;
        uVar28 = local_218;
      }
      if (uVar33 == 0) {
        uVar14 = *(ushort *)((long)ppMVar38 + lVar22 * 2 + -4);
        uVar18 = *(ushort *)((uVar28 - 2) + lVar22 * 2) + 2;
      }
      else {
        if ((char)uVar35 != '\0') break;
        uVar18 = *(ushort *)((uVar28 - 2) + lVar22 * 2) + uVar33 + 2;
        uVar14 = *(ushort *)((long)ppMVar38 + lVar22 * 2 + -4);
        if ((int)(((int)local_260 + uVar31) - (uint)uVar14) < (int)uVar18) break;
      }
      uVar31 = (uVar31 - uVar14) - 2;
      (&uStack_1dc)[(long)pvVar40] = uVar41;
      lVar22 = lVar22 + -1;
      uVar33 = uVar18;
      uVar45 = uVar41;
    } while (1 < lVar22);
    pvVar11 = local_168;
    auStack_1b8[(long)local_168] = uVar33;
    auStack_1b8[(long)pvVar40 + -1] = uVar31;
    uVar31 = 0;
    if (pvVar11 != (void *)0x1) {
      uVar31 = (&uStack_1dc)[(ulong)((int)pvVar11 - 2) + 1];
    }
    pvVar40 = (void *)((long)pvVar40 + -1);
  } while ((int)uVar31 < (int)uVar45);
LAB_00179616:
  uVar31 = 0;
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
  pCur = local_2a0;
  iVar16 = 0xb;
  goto LAB_00178a58;
LAB_001795ac:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
  pCur = local_2a0;
  uVar31 = 0;
  iVar16 = 0xb;
  goto LAB_00178a58;
LAB_001797cf:
  do {
    pBVar29 = local_270;
    if (local_1c0 < uVar35) {
      PVar21 = 1;
      if ((char)local_268 == '\0') {
        PVar21 = uStack_240._4_4_;
      }
      local_2ac = allocateBtreePage(local_270,(MemPage **)&local_138,(Pgno *)((long)&uStack_240 + 4)
                                    ,PVar21,'\0');
      pCur = local_2a0;
      uVar31 = uVar33;
      iVar16 = local_2ac;
      if (local_2ac != 0) goto LAB_00178a58;
      pMVar39 = (MemPage *)CONCAT44(local_138.nKey._4_4_,(int)local_138.nKey);
      zeroPage(pMVar39,(int)local_298);
      local_200[uVar35 - 1] = pMVar39;
      *(uint *)((long)local_158 + uVar35 * 4) = (uint)local_258;
      if (pBVar29->autoVacuum != '\0') {
        ptrmapPut(pBVar29,pMVar39->pgno,'\x05',local_2a8->pgno,&local_2ac);
        goto joined_r0x001798aa;
      }
    }
    else {
      pMVar39 = local_238[uVar35];
      local_200[uVar35 - 1] = pMVar39;
      local_238[uVar35] = (MemPage *)0x0;
      local_2ac = sqlite3PagerWrite(pMVar39->pDbPage);
joined_r0x001798aa:
      pCur = local_2a0;
      uVar31 = uVar33 + 1;
      iVar16 = local_2ac;
      if (local_2ac != 0) goto LAB_00178a58;
    }
    pCur = local_2a0;
    uVar33 = uVar33 + 1;
    uVar35 = uVar35 + 1;
  } while (uVar28 != uVar35);
  uVar31 = uVar33;
  if ((int)uVar33 < 1) {
    local_290 = (MemPage **)CONCAT44(local_290._4_4_,uStack_240._4_4_);
    local_268 = local_268 & 0xffffffff00000000;
  }
  else {
    uVar35 = (ulong)uVar33;
    uVar28 = 0;
    do {
      pMVar39 = local_200[uVar28 - 1];
      PVar21 = pMVar39->pgno;
      aPStack_48[uVar28] = PVar21;
      auStack_a8[uVar28] = PVar21;
      auStack_60[uVar28] = pMVar39->pDbPage->flags;
      if (uVar28 != 0) {
        uVar24 = 0;
        do {
          if (aPStack_48[uVar24] == PVar21) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption");
            iVar16 = 0xb;
            goto LAB_00178a58;
          }
          uVar24 = uVar24 + 1;
        } while (uVar28 != uVar24);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar35);
    uVar28 = 0;
    do {
      uVar24 = 0;
      if (uVar33 != 1) {
        uVar20 = 1;
        uVar25 = 0;
        do {
          uVar24 = uVar20 & 0xffffffff;
          if (auStack_a8[(int)uVar25] <= auStack_a8[uVar20]) {
            uVar24 = uVar25;
          }
          uVar20 = uVar20 + 1;
          uVar25 = uVar24;
        } while (uVar35 != uVar20);
      }
      lVar22 = (long)(int)uVar24;
      local_290 = (MemPage **)CONCAT44(local_290._4_4_,auStack_a8[lVar22]);
      auStack_a8[lVar22] = 0xffffffff;
      if (uVar28 != uVar24) {
        if ((long)uVar28 < lVar22) {
          pPVar8 = local_200[lVar22 + -1]->pDbPage;
          uVar5 = local_270->nPage;
          pPVar8->flags = 0;
          sqlite3PcacheMove(pPVar8,(int)uVar24 + uVar5 + 1);
        }
        pMVar39 = local_200[uVar28 - 1];
        pPVar8 = pMVar39->pDbPage;
        pPVar8->flags = auStack_60[lVar22];
        PVar21 = (uint)local_290;
        sqlite3PcacheMove(pPVar8,(uint)local_290);
        pMVar39->pgno = PVar21;
        uVar24 = extraout_RAX;
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != uVar35);
    local_268 = CONCAT44(local_268._4_4_,(int)CONCAT71((int7)(uVar24 >> 8),1));
  }
LAB_00179a9a:
  uStack_240._4_4_ = (uint)local_290;
  local_260 = (MemPage **)(long)(int)uVar31;
  uVar28 = (&local_210)[(long)local_260];
  uVar33 = *(uint *)(uVar28 + 4);
  *local_190 = uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 | uVar33 << 0x18;
  if ((((ulong)local_298 & 8) == 0) && ((uint)local_250 != uVar31)) {
    ppMVar43 = local_238;
    if ((int)(uint)local_250 < (int)uVar31) {
      ppMVar43 = (MemPage **)&local_208;
    }
    *(undefined4 *)(*(long *)(uVar28 + 0x50) + 8) = *(undefined4 *)(ppMVar43[local_1c0]->aData + 8);
  }
  uVar28 = local_258 & 0xffffffff;
  iVar16 = (uint)local_258;
  if (0 < (int)(uint)local_258 && local_270->autoVacuum != '\0') {
    uVar33 = (uint)((int)local_280 == 0);
    pMVar30 = (MemPage *)CONCAT44(local_208._4_4_,(int)local_208);
    ppMVar38 = (MemPage **)(ulong)((uint)pMVar30->nCell + (uint)pMVar30->nOverflow);
    ppMVar43 = (MemPage **)0x0;
    iVar17 = 0;
    local_298 = (MemPage **)((ulong)local_298 & 0xffffffff00000000);
    local_288 = (MemPage **)CONCAT44(local_288._4_4_,(uint)((int)local_280 == 0));
    pMVar39 = pMVar30;
    do {
      if (ppMVar43 == ppMVar38) {
        lVar22 = (long)iVar17;
        ppMVar23 = local_238 + lVar22 + 1;
        ppMVar26 = local_200 + lVar22;
        do {
          lVar22 = lVar22 + 1;
          ppMVar36 = ppMVar23;
          if (lVar22 < (long)local_260) {
            ppMVar36 = ppMVar26;
          }
          pMVar39 = *ppMVar36;
          ppMVar38 = (MemPage **)
                     (ulong)((int)ppMVar38 + uVar33 + (uint)pMVar39->nCell +
                            (uint)pMVar39->nOverflow);
          iVar17 = iVar17 + 1;
          ppMVar23 = ppMVar23 + 1;
          ppMVar26 = ppMVar26 + 1;
        } while (ppMVar43 == ppMVar38);
      }
      pMVar44 = (MemPage *)local_110.apCell[(long)ppMVar43];
      lVar22 = (long)(int)local_298;
      if (ppMVar43 == (MemPage **)(ulong)(&uStack_1dc)[lVar22 + 1]) {
        local_298 = (MemPage **)CONCAT44(local_298._4_4_,(int)local_298 + 1);
        pMVar30 = local_200[lVar22];
        if ((int)local_280 != 0) goto LAB_00179bc6;
      }
      else {
LAB_00179bc6:
        if (((((int)uVar31 <= iVar17) || (pMVar30->pgno != aPStack_48[iVar17])) ||
            (pMVar44 < (MemPage *)pMVar39->aData)) || ((MemPage *)pMVar39->aDataEnd <= pMVar44)) {
          local_290 = ppMVar43;
          if ((char)local_194 == '\0') {
            uVar33._0_1_ = pMVar44->isInit;
            uVar33._1_1_ = pMVar44->bBusy;
            uVar33._2_1_ = pMVar44->intKey;
            uVar33._3_1_ = pMVar44->intKeyLeaf;
            local_250 = pMVar44;
            ptrmapPut(local_270,
                      uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 |
                      uVar33 << 0x18,'\x05',pMVar30->pgno,&local_2ac);
            pMVar44 = local_250;
            uVar33 = (uint)local_288;
          }
          uVar14 = *(ushort *)((long)local_110.szCell + (long)local_290 * 2);
          if (uVar14 == 0) {
            local_250 = pMVar44;
            uVar14 = computeCellSize(&local_110,(int)local_290);
            pMVar44 = local_250;
            uVar33 = (uint)local_288;
          }
          if (pMVar30->minLocal < uVar14) {
            ptrmapPutOvflPtr(pMVar30,pMVar39,&pMVar44->isInit,&local_2ac);
            uVar33 = (uint)local_288;
          }
          pCur = local_2a0;
          iVar16 = local_2ac;
          if (local_2ac != 0) goto LAB_00178a58;
          uVar28 = local_110._0_8_ & 0xffffffff;
          ppMVar43 = local_290;
        }
      }
      ppMVar43 = (MemPage **)((long)ppMVar43 + 1);
      iVar16 = (int)uVar28;
    } while ((long)ppMVar43 < (long)iVar16);
  }
  ppuVar12 = local_110.apCell;
  local_258 = CONCAT44(local_258._4_4_,iVar16);
  if (1 < (int)uVar31) {
    local_290 = (MemPage **)local_110.szCell;
    local_298 = (MemPage **)(ulong)(uVar31 - 1);
    local_248 = local_248 & 0xffffffff;
    ppMVar43 = (MemPage **)0x0;
    iVar17 = 0;
    do {
      pMVar39 = local_200[(long)ppMVar43 + -1];
      lVar22 = (long)(int)(&uStack_1dc)[(long)ppMVar43 + 1];
      pMVar30 = (MemPage *)ppuVar12[lVar22];
      uVar14 = *(ushort *)((long)local_290 + lVar22 * 2);
      uVar33 = (uint)uVar14 + (int)alStack_88[3];
      pMVar44 = (MemPage *)((long)iVar17 + (long)local_180);
      if (pMVar39->leaf == '\0') {
        *(uint *)(pMVar39->aData + 8) = *(uint *)pMVar30;
      }
      else if ((int)local_280 == 0) {
        pMVar30 = (MemPage *)((long)&pMVar30[-1].xParseCell + 4);
        if (uVar14 == 4) {
          local_250 = pMVar30;
          uVar13 = (*local_2a8->xCellSize)(local_2a8,(u8 *)pMVar30);
          uVar33 = (uint)uVar13;
          pMVar30 = local_250;
        }
      }
      else {
        (*pMVar39->xParseCell)(pMVar39,(u8 *)ppuVar12[lVar22 + -1],&local_138);
        iVar16 = sqlite3PutVarint((uchar *)&pMVar44->pgno,
                                  CONCAT44(local_138.nKey._4_4_,(int)local_138.nKey));
        uVar33 = iVar16 + 4;
        pMVar30 = pMVar44;
        pMVar44 = (MemPage *)0x0;
      }
      insertCell(local_2a8,(int)local_248 + (int)ppMVar43,&pMVar30->isInit,uVar33,&pMVar44->isInit,
                 pMVar39->pgno,&local_2ac);
      pCur = local_2a0;
      iVar16 = local_2ac;
      if (local_2ac != 0) goto LAB_00178a58;
      iVar17 = iVar17 + uVar33;
      ppMVar43 = (MemPage **)((long)ppMVar43 + 1);
    } while (local_298 != ppMVar43);
  }
  uVar33 = 1 - uVar31;
  if ((int)uVar33 < (int)uVar31) {
    bVar46 = (int)local_280 == 0;
    uVar45 = (uint)bVar46;
    local_280 = CONCAT44(local_280._4_4_,local_1d8);
    iVar17 = uVar31 * 2 + -1;
    local_290 = (MemPage **)CONCAT44(local_290._4_4_,(uint)bVar46);
    do {
      uVar41 = -uVar33;
      if (0 < (int)uVar33) {
        uVar41 = uVar33;
      }
      uVar28 = (ulong)uVar41;
      if (*(char *)((long)&local_19c + uVar28) == '\0') {
        if ((int)uVar33 < 0) {
          if ((int)(&uStack_1dc)[(int)uVar41] <=
              *(int *)((long)local_158 + ((long)(int)uVar41 + -1) * 4)) goto LAB_00179e66;
        }
        else {
          if (uVar33 == 0) {
            iNew = 0;
            iVar16 = 0;
            nNew = (int)local_280;
          }
          else {
LAB_00179e66:
            if ((uint)local_170 < uVar41) {
              uVar35 = (ulong)(uVar41 - 1);
              iVar16 = (uint)local_258;
            }
            else {
              uVar35 = (ulong)(int)(uVar41 - 1);
              iVar16 = *(int *)((long)local_158 + uVar35 * 4) + uVar45;
            }
            iNew = (&uStack_1dc)[uVar35 + 1] + uVar45;
            nNew = (&uStack_1dc)[uVar28 + 1] - iNew;
          }
          pMVar39 = local_200[uVar28 - 1];
          iVar16 = editPage(pMVar39,iVar16,iNew,nNew,&local_110);
          pCur = local_2a0;
          if (iVar16 != 0) goto LAB_00178a58;
          *(undefined1 *)((long)&local_19c + uVar28) = 1;
          pMVar39->nFree = (int)local_210 - auStack_1b8[uVar28];
          uVar45 = (uint)local_290;
        }
      }
      uVar33 = uVar33 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  pBVar29 = local_270;
  pMVar39 = local_2a8;
  local_2ac = 0;
  if (((local_271 == '\x01') && (local_2a8->nCell == 0)) &&
     (pMVar30 = (MemPage *)CONCAT44(local_208._4_4_,(int)local_208),
     (int)(uint)local_2a8->hdrOffset <= pMVar30->nFree)) {
    local_2ac = defragmentPage(pMVar30,-1);
    copyNodeContent(pMVar30,pMVar39,&local_2ac);
    iVar17 = (int)local_170;
    iVar16 = local_2ac;
    if (local_2ac == 0) {
      iVar16 = freePage2(pMVar30->pBt,pMVar30,pMVar30->pgno);
    }
  }
  else {
    iVar17 = (int)local_170;
    iVar16 = 0;
    if (((byte)local_268 & (char)local_194 == '\0' & local_270->autoVacuum != '\0') == 1) {
      uVar28 = 0;
      do {
        uVar33 = *(uint *)(local_200[uVar28 - 1]->aData + 8);
        ptrmapPut(pBVar29,uVar33 >> 0x18 | (uVar33 & 0xff0000) >> 8 | (uVar33 & 0xff00) << 8 |
                          uVar33 << 0x18,'\x05',local_200[uVar28 - 1]->pgno,&local_2ac);
        uVar28 = uVar28 + 1;
        iVar16 = local_2ac;
      } while (uVar31 != uVar28);
    }
  }
  ppMVar43 = local_260;
  pCur = local_2a0;
  if ((int)uVar31 <= iVar17) {
    lVar22 = 0;
    do {
      if (iVar16 == 0) {
        pMVar39 = local_238[(long)ppMVar43 + lVar22];
        iVar16 = freePage2(pMVar39->pBt,pMVar39,pMVar39->pgno);
      }
      lVar22 = lVar22 + 1;
      pCur = local_2a0;
    } while ((iVar17 - uVar31) + 1 != (int)lVar22);
  }
LAB_00178a58:
  if ((MemPage **)local_110.apCell != (MemPage **)0x0) {
    sqlite3_free(local_110.apCell);
  }
LAB_00178a6a:
  uVar28 = 0;
  do {
    if (local_238[uVar28] != (MemPage *)0x0) {
      sqlite3PagerUnrefNotNull(local_238[uVar28]->pDbPage);
    }
    uVar28 = uVar28 + 1;
  } while (local_160 != uVar28);
  pMVar39 = local_118;
  if (0 < (int)uVar31) {
    uVar28 = 0;
    do {
      if (local_200[uVar28 - 1] != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(local_200[uVar28 - 1]->pDbPage);
      }
      uVar28 = uVar28 + 1;
      pMVar39 = local_118;
    } while (uVar31 != uVar28);
  }
LAB_00178ac0:
  if (local_188 != (void *)0x0) {
    pcache1Free(local_188);
  }
  local_188 = local_180;
LAB_00178ae2:
  pMVar39->nOverflow = '\0';
  sqlite3PagerUnrefNotNull(pMVar39->pDbPage);
  cVar27 = pCur->iPage + -1;
  pCur->iPage = cVar27;
  pMVar30 = pCur->apPage[cVar27];
LAB_00178b06:
  pCur->pPage = pMVar30;
  pMVar39 = pMVar30;
  if (iVar16 != 0) {
LAB_0017a056:
    if (local_188 != (void *)0x0) {
      pcache1Free(local_188);
    }
    return iVar16;
  }
  goto LAB_001785fb;
}

Assistant:

static int balance(BtCursor *pCur){
  int rc = SQLITE_OK;
  const int nMin = pCur->pBt->usableSize * 2 / 3;
  u8 aBalanceQuickSpace[13];
  u8 *pFree = 0;

  VVA_ONLY( int balance_quick_called = 0 );
  VVA_ONLY( int balance_deeper_called = 0 );

  do {
    int iPage = pCur->iPage;
    MemPage *pPage = pCur->pPage;

    if( NEVER(pPage->nFree<0) && btreeComputeFreeSpace(pPage) ) break;
    if( iPage==0 ){
      if( pPage->nOverflow ){
        /* The root page of the b-tree is overfull. In this case call the
        ** balance_deeper() function to create a new child for the root-page
        ** and copy the current contents of the root-page to it. The
        ** next iteration of the do-loop will balance the child page.
        */ 
        assert( balance_deeper_called==0 );
        VVA_ONLY( balance_deeper_called++ );
        rc = balance_deeper(pPage, &pCur->apPage[1]);
        if( rc==SQLITE_OK ){
          pCur->iPage = 1;
          pCur->ix = 0;
          pCur->aiIdx[0] = 0;
          pCur->apPage[0] = pPage;
          pCur->pPage = pCur->apPage[1];
          assert( pCur->pPage->nOverflow );
        }
      }else{
        break;
      }
    }else if( pPage->nOverflow==0 && pPage->nFree<=nMin ){
      break;
    }else{
      MemPage * const pParent = pCur->apPage[iPage-1];
      int const iIdx = pCur->aiIdx[iPage-1];

      rc = sqlite3PagerWrite(pParent->pDbPage);
      if( rc==SQLITE_OK && pParent->nFree<0 ){
        rc = btreeComputeFreeSpace(pParent);
      }
      if( rc==SQLITE_OK ){
#ifndef SQLITE_OMIT_QUICKBALANCE
        if( pPage->intKeyLeaf
         && pPage->nOverflow==1
         && pPage->aiOvfl[0]==pPage->nCell
         && pParent->pgno!=1
         && pParent->nCell==iIdx
        ){
          /* Call balance_quick() to create a new sibling of pPage on which
          ** to store the overflow cell. balance_quick() inserts a new cell
          ** into pParent, which may cause pParent overflow. If this
          ** happens, the next iteration of the do-loop will balance pParent 
          ** use either balance_nonroot() or balance_deeper(). Until this
          ** happens, the overflow cell is stored in the aBalanceQuickSpace[]
          ** buffer. 
          **
          ** The purpose of the following assert() is to check that only a
          ** single call to balance_quick() is made for each call to this
          ** function. If this were not verified, a subtle bug involving reuse
          ** of the aBalanceQuickSpace[] might sneak in.
          */
          assert( balance_quick_called==0 ); 
          VVA_ONLY( balance_quick_called++ );
          rc = balance_quick(pParent, pPage, aBalanceQuickSpace);
        }else
#endif
        {
          /* In this case, call balance_nonroot() to redistribute cells
          ** between pPage and up to 2 of its sibling pages. This involves
          ** modifying the contents of pParent, which may cause pParent to
          ** become overfull or underfull. The next iteration of the do-loop
          ** will balance the parent page to correct this.
          ** 
          ** If the parent page becomes overfull, the overflow cell or cells
          ** are stored in the pSpace buffer allocated immediately below. 
          ** A subsequent iteration of the do-loop will deal with this by
          ** calling balance_nonroot() (balance_deeper() may be called first,
          ** but it doesn't deal with overflow cells - just moves them to a
          ** different page). Once this subsequent call to balance_nonroot() 
          ** has completed, it is safe to release the pSpace buffer used by
          ** the previous call, as the overflow cell data will have been 
          ** copied either into the body of a database page or into the new
          ** pSpace buffer passed to the latter call to balance_nonroot().
          */
          u8 *pSpace = sqlite3PageMalloc(pCur->pBt->pageSize);
          rc = balance_nonroot(pParent, iIdx, pSpace, iPage==1,
                               pCur->hints&BTREE_BULKLOAD);
          if( pFree ){
            /* If pFree is not NULL, it points to the pSpace buffer used 
            ** by a previous call to balance_nonroot(). Its contents are
            ** now stored either on real database pages or within the 
            ** new pSpace buffer, so it may be safely freed here. */
            sqlite3PageFree(pFree);
          }

          /* The pSpace buffer will be freed after the next call to
          ** balance_nonroot(), or just before this function returns, whichever
          ** comes first. */
          pFree = pSpace;
        }
      }

      pPage->nOverflow = 0;

      /* The next iteration of the do-loop balances the parent page. */
      releasePage(pPage);
      pCur->iPage--;
      assert( pCur->iPage>=0 );
      pCur->pPage = pCur->apPage[pCur->iPage];
    }
  }while( rc==SQLITE_OK );

  if( pFree ){
    sqlite3PageFree(pFree);
  }
  return rc;
}